

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O3

void __thiscall chrono::ChConstraintNgeneric::Update_auxiliary(ChConstraintNgeneric *this)

{
  double dVar1;
  pointer pMVar2;
  pointer pMVar3;
  long lVar4;
  int iVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  char *__function;
  ulong uVar8;
  long lVar9;
  scalar_sum_op<double,_double> local_a9;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a8;
  long local_90;
  undefined8 uStack_88;
  double *local_78;
  Scalar local_70;
  long local_68;
  double *pdStack_60;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_48;
  
  ppCVar7 = (this->variables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->variables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar6 != ppCVar7) {
    lVar9 = 1;
    uVar8 = 0;
    do {
      if (ppCVar7[uVar8]->disabled == false) {
        iVar5 = (*ppCVar7[uVar8]->_vptr_ChVariables[2])();
        ppCVar7 = (this->variables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (iVar5 != 0) {
          pMVar2 = (this->Eq).
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68 = *(long *)((long)pMVar2 + lVar9 * 8 + -8);
          pdStack_60 = (&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data)[lVar9];
          if ((long)pdStack_60 < 0 && local_68 != 0) {
            __function = 
            "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
            ;
LAB_007db958:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
          }
          pMVar3 = (this->Cq).
                   super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_90 = 0;
          uStack_88 = 0;
          local_a8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ = *(long *)((long)pMVar3 + lVar9 * 8 + -8);
          local_a8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.
          super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
          .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data
               = (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
                 (&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                   m_storage.m_data)[lVar9];
          if ((long)local_a8.
                    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    .
                    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                    .m_d.lhsImpl.
                    super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                    .
                    super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
                    .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                    .m_d.data < 0 &&
              local_a8.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d._0_8_ != 0) {
            __function = 
            "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
            ;
            goto LAB_007db958;
          }
          (*ppCVar7[uVar8]->_vptr_ChVariables[4])(ppCVar7[uVar8],&local_68,&local_a8);
          if (local_90 != 0) {
            free(*(void **)(local_90 + -8));
          }
          ppCVar7 = (this->variables).
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      ppCVar6 = (this->variables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 2;
    } while (uVar8 < (ulong)((long)ppCVar6 - (long)ppCVar7 >> 3));
  }
  (this->super_ChConstraint).g_i = 0.0;
  if (ppCVar6 != ppCVar7) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      if (ppCVar7[uVar8]->disabled == false) {
        iVar5 = (*ppCVar7[uVar8]->_vptr_ChVariables[2])();
        if (0 < iVar5) {
          pMVar3 = (this->Cq).
                   super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar2 = (this->Eq).
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = *(long *)((long)&(pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                   m_storage.m_cols + lVar9);
          if (lVar4 != *(long *)((long)&(pMVar2->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        ).m_storage.m_rows + lVar9)) {
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                          "Eigen::Product<Eigen::Matrix<double, 1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                         );
          }
          local_48.m_rhs =
               (RhsNested)
               ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + lVar9);
          local_48.m_lhs.m_matrix =
               (non_const_type)
               ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                       m_storage.m_data + lVar9);
          local_78 = &local_70;
          if (lVar4 == 0) {
            local_70 = 0.0;
          }
          else {
            if (lVar4 < 1) {
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, 1, -1>>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, 1, -1>>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                           );
            }
            local_a8.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.
            super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.
            super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.
            data = *(evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
                    &((unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
                       *)((long)&(pMVar3->
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                 m_storage.m_data + lVar9))->m_argImpl;
            local_a8.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   ((local_48.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_data;
            local_70 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 (&local_a8,&local_a9,&local_48);
          }
          (this->super_ChConstraint).g_i = *local_78 + (this->super_ChConstraint).g_i;
        }
      }
      ppCVar7 = (this->variables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)(this->variables).
                                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar7 >> 3))
    ;
  }
  dVar1 = (this->super_ChConstraint).cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (this->super_ChConstraint).g_i = dVar1 + (this->super_ChConstraint).g_i;
  }
  return;
}

Assistant:

void ChConstraintNgeneric::Update_auxiliary() {
    // 1- Assuming jacobians are already computed, now compute
    //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]

    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive())
            if (variables[i]->Get_ndof()) {
                variables[i]->Compute_invMb_v(Eq[i], Cq[i].transpose());
            }
    }

    // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
    g_i = 0;
    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive() && variables[i]->Get_ndof() > 0) {
            g_i += Cq[i] * Eq[i];
        }
    }

    // 3- adds the constraint force mixing term (usually zero):
    if (cfm_i)
        g_i += cfm_i;
}